

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O3

int Abc_CommandAbcLivenessToSafetyAbstraction(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  FILE *__s;
  Aig_Man_t *pAVar4;
  Aig_Man_t *pAig;
  Vec_Ptr_t *vLive;
  Vec_Ptr_t *vFair;
  Vec_Ptr_t *vAssertSafety;
  Vec_Ptr_t *vAssumeSafety;
  Vec_Int_t *vFlops;
  Abc_Ntk_t *pNtk;
  char *__dest;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  
  pAVar3 = (Aig_Man_t *)Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  uVar5 = 0;
  if (argc != 1) {
    Extra_UtilGetoptReset();
    uVar1 = 0xffffffff;
    do {
      while( true ) {
        while (uVar5 = uVar1, iVar2 = Extra_UtilGetopt(argc,argv,"1slh"), iVar2 < 0x6c) {
          if (iVar2 != 0x31) {
            if (iVar2 == -1) goto LAB_00634737;
            goto LAB_00634752;
          }
          uVar1 = 4;
          if (uVar5 != 0xffffffff) {
            if (2 < uVar5) {
              __assert_fail("directive == IGNORE_LIVENESS_KEEP_SAFETY_MODE || directive == IGNORE_SAFETY_KEEP_LIVENESS_MODE"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/liveness.c"
                            ,0x65e,
                            "int Abc_CommandAbcLivenessToSafetyAbstraction(Abc_Frame_t *, int, char **)"
                           );
            }
            uVar1 = (uint)(uVar5 != 1) * 2 + 1;
          }
        }
        if (iVar2 == 0x6c) break;
        if (iVar2 != 0x73) goto LAB_00634752;
        uVar1 = 2;
        if (uVar5 != 0xffffffff) {
          if (uVar5 != 4) goto LAB_00634752;
          uVar1 = 3;
        }
      }
      uVar1 = 1;
    } while ((uVar5 == 0xffffffff) || (uVar5 == 4));
LAB_00634752:
    fwrite("usage: l2s [-1lsh]\n",0x13,1,_stdout);
    fwrite("\t         performs Armin Biere\'s live-to-safe transformation\n",0x3d,1,_stdout);
    fwrite("\t-1 : no shadow logic, presume all loops are self loops\n",0x38,1,_stdout);
    fwrite("\t-l : ignore liveness and fairness outputs\n",0x2b,1,_stdout);
    fwrite("\t-s : ignore safety assertions and assumptions\n",0x2f,1,_stdout);
    pcVar7 = "\t-h : print command usage\n";
    sVar6 = 0x1a;
    __s = _stdout;
LAB_00634800:
    fwrite(pcVar7,sVar6,1,__s);
    return 1;
  }
LAB_00634737:
  if (pAVar3 == (Aig_Man_t *)0x0) {
    pcVar7 = "Empty network.\n";
    sVar6 = 0xf;
    goto LAB_00634800;
  }
  pAVar4 = pAVar3;
  if (*(Abc_NtkType_t *)&pAVar3->pName != ABC_NTK_STRASH) {
    puts("The input network was not strashed, strashing....");
    pAVar4 = (Aig_Man_t *)Abc_NtkStrash((Abc_Ntk_t *)pAVar3,0,0,0);
  }
  pAig = Abc_NtkToDar((Abc_Ntk_t *)pAVar4,0,1);
  vLive = populateLivenessVector((Abc_Ntk_t *)pAVar3,pAig);
  vFair = populateFairnessVector((Abc_Ntk_t *)pAVar3,pAig);
  vAssertSafety = populateSafetyAssertionVector((Abc_Ntk_t *)pAVar3,pAig);
  pAVar4 = pAVar3;
  vAssumeSafety = populateSafetyAssumptionVector((Abc_Ntk_t *)pAVar3,pAig);
  vFlops = prepareFlopVector(pAVar4,pAig->nRegs >> 1);
  switch(uVar5) {
  case 0:
    pAVar3 = LivenessToSafetyTransformationAbs
                       (0,(Abc_Ntk_t *)pAVar3,pAig,vFlops,vLive,vFair,vAssertSafety,vAssumeSafety);
    if (pAVar3->nRegs == 0) goto LAB_006349c9;
    pcVar7 = 
    "A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed"
    ;
    break;
  case 1:
    pAVar3 = LivenessToSafetyTransformationAbs
                       (1,(Abc_Ntk_t *)pAVar3,pAig,vFlops,vLive,vFair,vAssertSafety,vAssumeSafety);
    if (pAVar3->nRegs == 0) goto LAB_006349c9;
    pcVar7 = 
    "A new circuit is produced with\n\t1 PO - only for safety property; liveness properties are ignored, if any.\n\tno additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed"
    ;
    break;
  case 2:
    pAVar3 = LivenessToSafetyTransformationAbs
                       (2,(Abc_Ntk_t *)pAVar3,pAig,vFlops,vLive,vFair,vAssertSafety,vAssumeSafety);
    if (pAVar3->nRegs == 0) goto LAB_006349c9;
    pcVar7 = 
    "A new circuit is produced with\n\t1 PO - only for liveness property; safety properties are ignored, if any.\n\tone additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed"
    ;
    break;
  case 3:
    pAVar3 = LivenessToSafetyTransformationOneStepLoop
                       (3,(Abc_Ntk_t *)pAVar3,pAig,vLive,vFair,vAssertSafety,vAssumeSafety);
    if (pAVar3->nRegs == 0) goto LAB_006349c9;
    pcVar7 = 
    "New circuit is produced ignoring safety outputs!\nOnly liveness and fairness outputs are considered.\nShadow registers are not created"
    ;
    break;
  case 4:
    pAVar3 = LivenessToSafetyTransformationOneStepLoop
                       (4,(Abc_Ntk_t *)pAVar3,pAig,vLive,vFair,vAssertSafety,vAssumeSafety);
    if (pAVar3->nRegs == 0) goto LAB_006349c9;
    pcVar7 = 
    "A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere\'s nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed"
    ;
    break;
  default:
    pAVar3 = (Aig_Man_t *)0x0;
    goto LAB_006349c9;
  }
  puts(pcVar7);
LAB_006349c9:
  pNtk = Abc_NtkFromAigPhase(pAVar3);
  pcVar7 = pAVar3->pName;
  if (pcVar7 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar7);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,pcVar7);
  }
  pNtk->pName = __dest;
  iVar2 = Abc_NtkCheck(pNtk);
  if (iVar2 == 0) {
    fwrite("Abc_NtkCreateCone(): Network check has failed.\n",0x2f,1,_stdout);
  }
  updateNewNetworkNameManager(pNtk,pAVar3,vecPiNames,vecLoNames);
  Abc_FrameSetCurrentNetwork(pAbc,pNtk);
  return 0;
}

Assistant:

int Abc_CommandAbcLivenessToSafetyAbstraction( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkNew, *pNtkOld;
    Aig_Man_t * pAig, *pAigNew = NULL;
    int c;
    Vec_Ptr_t * vLive, * vFair, *vAssertSafety, *vAssumeSafety;
    int directive = -1;
    Vec_Int_t * vFlops;
                
    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    if( argc == 1 )
    {
        assert( directive == -1 );
        directive = FULL_BIERE_MODE;
    }
    else
    {
        Extra_UtilGetoptReset();
        while ( ( c = Extra_UtilGetopt( argc, argv, "1slh" ) ) != EOF )
        {
            switch( c )
            {
            case '1': 
                if( directive == -1 )
                    directive = FULL_BIERE_ONE_LOOP_MODE;
                else
                {
                    assert( directive == IGNORE_LIVENESS_KEEP_SAFETY_MODE || directive == IGNORE_SAFETY_KEEP_LIVENESS_MODE );
                    if( directive == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                        directive = IGNORE_LIVENESS_KEEP_SAFETY_MODE;
                    else
                        directive = IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE;
                }
                break;
            case 's':
                if( directive == -1 )
                    directive = IGNORE_SAFETY_KEEP_LIVENESS_MODE;
                else
                {
                    if( directive != FULL_BIERE_ONE_LOOP_MODE )
                        goto usage;
                    assert(directive == FULL_BIERE_ONE_LOOP_MODE);
                    directive = IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE;
                }
                break;
            case 'l':
                if( directive == -1 )
                    directive = IGNORE_LIVENESS_KEEP_SAFETY_MODE;
                else
                {
                    if( directive != FULL_BIERE_ONE_LOOP_MODE )
                        goto usage;
                    assert(directive == FULL_BIERE_ONE_LOOP_MODE);
                    directive = IGNORE_LIVENESS_KEEP_SAFETY_MODE;
                }
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
            }
        }
    }

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }
    if( !Abc_NtkIsStrash( pNtk ) )
    {
        printf("The input network was not strashed, strashing....\n");
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkOld = pNtkTemp;
        pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
        vAssertSafety = populateSafetyAssertionVector( pNtk, pAig );
        vAssumeSafety = populateSafetyAssumptionVector( pNtk, pAig );
    }
    else
    {
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        pNtkOld = pNtk;
        vLive = populateLivenessVector( pNtk, pAig );
        vFair = populateFairnessVector( pNtk, pAig );
        vAssertSafety = populateSafetyAssertionVector( pNtk, pAig );
        vAssumeSafety = populateSafetyAssumptionVector( pNtk, pAig );
    }

    vFlops = prepareFlopVector( pAig, Aig_ManRegNum(pAig)%2 == 0? Aig_ManRegNum(pAig)/2 : (Aig_ManRegNum(pAig)-1)/2);

    //vFlops = prepareFlopVector( pAig, 100 );

    switch( directive )
    {
    case FULL_BIERE_MODE:
        //if( Vec_PtrSize(vLive) == 0 && Vec_PtrSize(vAssertSafety) == 0 )
        //{
        //    printf("Input circuit has NO safety and NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationAbs( FULL_BIERE_MODE, pNtk, pAig, vFlops, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed\n");
            break;
        //}
    case FULL_BIERE_ONE_LOOP_MODE:
        //if( Vec_PtrSize(vLive) == 0 && Vec_PtrSize(vAssertSafety) == 0 )
        //{
        //    printf("Input circuit has NO safety and NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationOneStepLoop( FULL_BIERE_ONE_LOOP_MODE, pNtk, pAig, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t2 POs - one for safety and one for liveness.\n\tone additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed\n");
            break;
        //}
    case IGNORE_LIVENESS_KEEP_SAFETY_MODE:
        //if( Vec_PtrSize(vAssertSafety) == 0 )
        //{    
        //    printf("Input circuit has NO safety property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationAbs( IGNORE_LIVENESS_KEEP_SAFETY_MODE, pNtk, pAig, vFlops, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t1 PO - only for safety property; liveness properties are ignored, if any.\n\tno additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created\n\tnon-property POs are suppressed\n");
            break;
        //}
    case IGNORE_SAFETY_KEEP_LIVENESS_MODE:
        //if( Vec_PtrSize(vLive) == 0 )
        //{    
        //    printf("Input circuit has NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationAbs( IGNORE_SAFETY_KEEP_LIVENESS_MODE, pNtk, pAig, vFlops, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("A new circuit is produced with\n\t1 PO - only for liveness property; safety properties are ignored, if any.\n\tone additional input is added (due to Biere's nondeterminism)\n\tshadow flops are not created if the original circuit is combinational\n\tnon-property POs are suppressed\n");
            break;
        //}
    case IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE:
        //if( Vec_PtrSize(vLive) == 0 )
        //{
        //    printf("Input circuit has NO liveness property, original network is not disturbed\n");
        //    return 1;
        //}
        //else
        //{
            pAigNew = LivenessToSafetyTransformationOneStepLoop( IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE, pNtk, pAig, vLive, vFair, vAssertSafety, vAssumeSafety );
            if( Aig_ManRegNum(pAigNew) != 0 )
                printf("New circuit is produced ignoring safety outputs!\nOnly liveness and fairness outputs are considered.\nShadow registers are not created\n");
            break;
        //}
    }

    pNtkNew = Abc_NtkFromAigPhase( pAigNew );
    pNtkNew->pName = Abc_UtilStrsav( pAigNew->pName );
    
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    
    updateNewNetworkNameManager( pNtkNew, pAigNew, vecPiNames,vecLoNames );
    Abc_FrameSetCurrentNetwork( pAbc, pNtkNew );

#if 0
#ifndef DUPLICATE_CKT_DEBUG
    Saig_ManForEachPi( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecPiNames, i), retrieveTruePiName( pNtk, pAig, pAigNew, pObj ) ) == 0 );
        //printf("Name of %d-th Pi = %s, %s\n", i, retrieveTruePiName( pNtk, pAig, pAigNew, pObj ), (char *)Vec_PtrEntry(vecPiNames, i) );

    Saig_ManForEachLo( pAigNew, pObj, i )
        assert( strcmp( (char *)Vec_PtrEntry(vecLoNames, i), retrieveLOName( pNtk, pAig, pAigNew, pObj, vLive, vFair ) ) == 0 );
#endif    
#endif
        
    return 0;

usage:
    fprintf( stdout, "usage: l2s [-1lsh]\n" );
    fprintf( stdout, "\t         performs Armin Biere's live-to-safe transformation\n" );
    fprintf( stdout, "\t-1 : no shadow logic, presume all loops are self loops\n");
    fprintf( stdout, "\t-l : ignore liveness and fairness outputs\n");
    fprintf( stdout, "\t-s : ignore safety assertions and assumptions\n");
    fprintf( stdout, "\t-h : print command usage\n");
    return 1;
}